

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

predictor * __thiscall
Search::predictor::add_allowed(predictor *this,v_array<std::pair<unsigned_int,_float>_> *a)

{
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (ulong)((long)a->_end - (long)a->_begin >> 3); uVar1 = uVar1 + 1) {
    add_to<unsigned_int>
              (this,&this->allowed_actions,&this->allowed_is_pointer,a->_begin[uVar1].first,false);
    add_to<float>(this,&this->allowed_actions_cost,&this->allowed_cost_is_pointer,
                  a->_begin[uVar1].second,false);
  }
  return this;
}

Assistant:

predictor& predictor::add_allowed(v_array<pair<action, float>>& a)
{
  for (size_t i = 0; i < a.size(); i++)
  {
    add_to(allowed_actions, allowed_is_pointer, a[i].first, false);
    add_to(allowed_actions_cost, allowed_cost_is_pointer, a[i].second, false);
  }
  return *this;
}